

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void cjson_array_foreach_should_loop_over_arrays(void)

{
  long lVar1;
  long in_FS_OFFSET;
  ulong local_2e8;
  size_t i;
  cJSON *element_pointer;
  cJSON elements [10];
  cJSON array [1];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&elements[9].string,0,0x40);
  memset(&element_pointer,0,0x280);
  i = (size_t)&element_pointer;
  elements[0].next = (cJSON *)0x0;
  elements[8].string = (char *)0x0;
  for (local_2e8 = 0; local_2e8 < 9; local_2e8 = local_2e8 + 1) {
    elements[local_2e8 - 1].string = (char *)&elements[local_2e8].string;
    elements[local_2e8 + 1].next = (cJSON *)&elements[local_2e8 - 1].string;
  }
  local_2e8 = 0;
  for (; i != 0; i = *(size_t *)i) {
    if ((char **)i != &elements[local_2e8 + -1].string) {
      UnityFail("Not iterating over array properly",0x37);
    }
    local_2e8 = local_2e8 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void cjson_array_foreach_should_loop_over_arrays(void)
{
    cJSON array[1];
    cJSON elements[10];
    cJSON *element_pointer = NULL;
    size_t i = 0;

    memset(array, 0, sizeof(array));
    memset(elements, 0, sizeof(elements));

    /* create array */
    array[0].child = &elements[0];
    elements[0].prev = NULL;
    elements[9].next = NULL;
    for (i = 0; i < 9; i++)
    {
        elements[i].next = &elements[i + 1];
        elements[i + 1].prev = &elements[i];
    }

    i = 0;
    cJSON_ArrayForEach(element_pointer, array)
    {
        TEST_ASSERT_TRUE_MESSAGE(element_pointer == &elements[i], "Not iterating over array properly");
        i++;
    }
}